

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O0

void __thiscall
duckdb::WindowExecutorLocalState::Finalize
          (WindowExecutorLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection
          )

{
  WindowCollection *in_RDX;
  long in_RSI;
  optional_ptr<duckdb::WindowCollection,_true> *in_RDI;
  column_t range_idx;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
  *in_stack_ffffffffffffffc8;
  optional_ptr<duckdb::WindowCollection,_true> *args_1;
  
  if (*(long *)(*(long *)(in_RSI + 8) + 0x30) != -1) {
    args_1 = in_RDI;
    optional_ptr<duckdb::WindowCollection,_true>::operator*(in_RDI);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,unsigned_long_const&>
              (in_RDX,(unsigned_long *)args_1);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator=
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               in_RDI,in_stack_ffffffffffffffc8);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               0x1a3cc40);
  }
  return;
}

Assistant:

void WindowExecutorLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	const auto range_idx = gstate.executor.range_idx;
	if (range_idx != DConstants::INVALID_INDEX) {
		range_cursor = make_uniq<WindowCursor>(*collection, range_idx);
	}
}